

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O3

ssize_t __thiscall
QHttpSocketEngine::read(QHttpSocketEngine *this,int __fd,void *__buf,size_t __nbytes)

{
  SocketState SVar1;
  long lVar2;
  long lVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QString local_68;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)(this + 8);
  lVar2 = QIODevice::read(*(char **)(lVar3 + 0xf8),CONCAT44(in_register_00000034,__fd));
  SVar1 = QAbstractSocket::state(*(QAbstractSocket **)(lVar3 + 0xf8));
  if (SVar1 == UnconnectedState) {
    lVar3 = (**(code **)(**(long **)(lVar3 + 0xf8) + 0xa0))();
    if (lVar3 == 0) {
      emitReadNotification(this);
    }
  }
  if (lVar2 == -1) {
    (**(code **)(*(long *)this + 0xa8))(this);
    QVar4.m_data = (storage_type *)0x12;
    QVar4.m_size = (qsizetype)&local_48;
    QString::fromLatin1(QVar4);
    local_68.d.d = (Data *)local_48;
    local_68.d.ptr = pcStack_40;
    local_68.d.size = local_38;
    QAbstractSocketEngine::setError((QAbstractSocketEngine *)this,RemoteHostClosedError,&local_68);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,UnconnectedState);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return lVar2;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QHttpSocketEngine::read(char *data, qint64 maxlen)
{
    Q_D(QHttpSocketEngine);
    qint64 bytesRead = d->socket->read(data, maxlen);

    if (d->socket->state() == QAbstractSocket::UnconnectedState
        && d->socket->bytesAvailable() == 0) {
        emitReadNotification();
    }

    if (bytesRead == -1) {
        // If nothing has been read so far, and the direct socket read
        // failed, return the socket's error. Otherwise, fall through and
        // return as much as we read so far.
        close();
        setError(QAbstractSocket::RemoteHostClosedError, "Remote host closed"_L1);
        setState(QAbstractSocket::UnconnectedState);
        return -1;
    }
    return bytesRead;
}